

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O2

ScenarioLowerBound * __thiscall
despot::POMDPX::CreateScenarioLowerBound(POMDPX *this,string *name,string *particle_bound_name)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ScenarioLowerBound *this_00;
  ModeStatePolicy *this_01;
  undefined4 extraout_var;
  POMCPScenarioLowerBound *this_02;
  POMCPPrior *prior;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ostream *poVar4;
  DSPOMDP *pDVar5;
  string *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  if ((this->is_small_ == false) &&
     ((bVar1 = std::operator==(name,"MAJORITY"), bVar1 ||
      (bVar1 = std::operator==(name,"MODE"), bVar1)))) {
    this_00 = (ScenarioLowerBound *)operator_new(0x10);
    TrivialParticleLowerBound::TrivialParticleLowerBound
              ((TrivialParticleLowerBound *)this_00,&this->super_DSPOMDP);
  }
  else {
    bVar1 = std::operator==(name,"TRIVIAL");
    if ((!bVar1) && (bVar1 = std::operator==(name,"DEFAULT"), !bVar1)) {
      bVar1 = std::operator==(name,"RANDOM");
      if (bVar1) {
        this_01 = (ModeStatePolicy *)operator_new(0x38);
        std::__cxx11::string::string(local_50,(string *)particle_bound_name);
        pDVar5 = &this->super_DSPOMDP;
        this_03 = local_50;
        iVar2 = (*pDVar5->_vptr_DSPOMDP[0xe])(pDVar5,this_03);
        RandomPolicy::RandomPolicy
                  ((RandomPolicy *)this_01,pDVar5,(ParticleLowerBound *)CONCAT44(extraout_var,iVar2)
                  );
      }
      else {
        bVar1 = std::operator==(name,"POMCP");
        if (bVar1) {
          this_02 = (POMCPScenarioLowerBound *)operator_new(0x20);
          prior = (POMCPPrior *)operator_new(0x78);
          UniformPOMCPPrior::UniformPOMCPPrior((UniformPOMCPPrior *)prior,&this->super_DSPOMDP);
          POMCPScenarioLowerBound::POMCPScenarioLowerBound
                    (this_02,&this->super_DSPOMDP,prior,(Belief *)0x0);
          return &this_02->super_ScenarioLowerBound;
        }
        bVar1 = std::operator==(name,"MAJORITY");
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f0,"MDP",(allocator<char> *)&local_130);
          ComputeDefaultActions(this,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          this_01 = (ModeStatePolicy *)operator_new(0x28);
          std::__cxx11::string::string(local_70,(string *)particle_bound_name);
          pDVar5 = &this->super_DSPOMDP;
          this_03 = local_70;
          iVar2 = (*pDVar5->_vptr_DSPOMDP[0xe])(pDVar5,this_03);
          MajorityActionPolicy::MajorityActionPolicy
                    ((MajorityActionPolicy *)this_01,pDVar5,&this->super_StatePolicy,
                     (ParticleLowerBound *)CONCAT44(extraout_var_00,iVar2));
        }
        else {
          bVar1 = std::operator==(name,"GREEDY");
          if (bVar1) {
            this_01 = (ModeStatePolicy *)operator_new(0x28);
            std::__cxx11::string::string(local_90,(string *)particle_bound_name);
            pDVar5 = &this->super_DSPOMDP;
            this_03 = local_90;
            iVar2 = (*pDVar5->_vptr_DSPOMDP[0xe])(pDVar5,this_03);
            POMDPXGreedyActionPolicy::POMDPXGreedyActionPolicy
                      ((POMDPXGreedyActionPolicy *)this_01,pDVar5,
                       (ParticleLowerBound *)CONCAT44(extraout_var_01,iVar2));
          }
          else {
            bVar1 = std::operator==(name,"MODE");
            if (bVar1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_110,"MDP",(allocator<char> *)&local_130);
              ComputeDefaultActions(this,&local_110);
              std::__cxx11::string::~string((string *)&local_110);
              this_01 = (ModeStatePolicy *)operator_new(0x48);
              std::__cxx11::string::string(local_b0,(string *)particle_bound_name);
              pDVar5 = &this->super_DSPOMDP;
              this_03 = local_b0;
              iVar2 = (*pDVar5->_vptr_DSPOMDP[0xe])(pDVar5,this_03);
              ModeStatePolicy::ModeStatePolicy
                        (this_01,pDVar5,&this->super_StateIndexer,&this->super_StatePolicy,
                         (ParticleLowerBound *)CONCAT44(extraout_var_02,iVar2));
            }
            else {
              std::__cxx11::string::substr((ulong)&local_130,(ulong)name);
              bVar1 = std::operator==(&local_130,"BLIND");
              std::__cxx11::string::~string((string *)&local_130);
              if (!bVar1) {
                poVar4 = std::operator<<((ostream *)&std::cerr,"Unsupported scenario lower bound: ")
                ;
                poVar4 = std::operator<<(poVar4,(string *)name);
                std::endl<char,std::char_traits<char>>(poVar4);
                exit(1);
              }
              std::__cxx11::string::substr((ulong)&local_130,(ulong)name);
              iVar2 = std::__cxx11::stoi(&local_130,(size_t *)0x0,10);
              std::__cxx11::string::~string((string *)&local_130);
              this_01 = (ModeStatePolicy *)operator_new(0x28);
              std::__cxx11::string::string(local_d0,(string *)particle_bound_name);
              pDVar5 = &this->super_DSPOMDP;
              this_03 = local_d0;
              iVar3 = (*pDVar5->_vptr_DSPOMDP[0xe])(pDVar5,this_03);
              BlindPolicy::BlindPolicy
                        ((BlindPolicy *)this_01,pDVar5,iVar2,
                         (ParticleLowerBound *)CONCAT44(extraout_var_03,iVar3));
            }
          }
        }
      }
      std::__cxx11::string::~string(this_03);
      return (ScenarioLowerBound *)this_01;
    }
    this_00 = (ScenarioLowerBound *)operator_new(0x10);
    TrivialParticleLowerBound::TrivialParticleLowerBound
              ((TrivialParticleLowerBound *)this_00,&this->super_DSPOMDP);
  }
  return this_00;
}

Assistant:

ScenarioLowerBound* POMDPX::CreateScenarioLowerBound(string name,
	string particle_bound_name) const {
	if (!is_small_ && (name == "MAJORITY" || name == "MODE")) {
		return new TrivialParticleLowerBound(this);
	}

	const StatePolicy* policy = this;
	const StateIndexer* indexer = this;

	if (name == "TRIVIAL" || name == "DEFAULT") {
		return new TrivialParticleLowerBound(this);
	} else if (name == "RANDOM") {
		return new RandomPolicy(this,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "POMCP") {
		return new POMCPScenarioLowerBound(this, new UniformPOMCPPrior(this));
	} else if (name == "MAJORITY") {
		ComputeDefaultActions("MDP");
		return new MajorityActionPolicy(this, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "GREEDY") {
		return new POMDPXGreedyActionPolicy(this,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MODE") {
		ComputeDefaultActions("MDP");
		return new ModeStatePolicy(this, *indexer, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name.substr(0, 5) == "BLIND") { 
		int action = stoi(name.substr(5)); 
		return new BlindPolicy(this, action, 
				CreateParticleLowerBound(particle_bound_name)); 
	} else {
		cerr << "Unsupported scenario lower bound: " << name << endl;
		exit(1);
		return NULL;
	}
}